

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

string * __thiscall
Parse::toSymTypeName_abi_cxx11_(string *__return_storage_ptr__,Parse *this,Type *type)

{
  allocator local_39;
  allocator local_38;
  allocator local_37;
  allocator local_36;
  allocator local_35 [20];
  allocator local_21;
  Type *local_20;
  Type *type_local;
  Parse *this_local;
  
  local_20 = type;
  type_local = (Type *)this;
  this_local = (Parse *)__return_storage_ptr__;
  if (*type == INT) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"int",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else if (*type == BOOL) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"bool",local_35);
    std::allocator<char>::~allocator((allocator<char> *)local_35);
  }
  else if (*type == CHAR) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"char",&local_36);
    std::allocator<char>::~allocator((allocator<char> *)&local_36);
  }
  else if (*type == DOUBLE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"double",&local_37);
    std::allocator<char>::~allocator((allocator<char> *)&local_37);
  }
  else if (*type == ARRAY) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"arr",&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_38);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return __return_storage_ptr__;
}

Assistant:

string Parse::toSymTypeName(Type &type) {

    if(type == Type::INT) {
        return "int";
    } else if(type == Type::BOOL) {
        return "bool";
    } else if(type == Type::CHAR) {
        return "char";
    } else if(type == Type::DOUBLE) {
        return "double";
    } else if(type == Type::ARRAY) {
        return "arr";
    }
    return "";
}